

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O2

void __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  bool bVar1;
  id tid_00;
  id tid;
  unique_lock<std::mutex> lk;
  
  tid_00._M_thread = pthread_self();
  tid._M_thread = tid_00._M_thread;
  std::unique_lock<std::mutex>::unique_lock(&lk,&this->mtx_);
  if ((this->e_owner_)._M_thread != tid_00._M_thread) {
    bVar1 = is_shared_owner(this,tid_00);
    if (!bVar1) {
      while( true ) {
        if (-1 < (long)(this->state_).rwcount) {
          rwlock::ReaderPrefer::acquire_rlock(&this->state_);
          std::vector<std::thread::id,_std::allocator<std::thread::id>_>::push_back
                    (&this->s_owner_,&tid);
          validator::deadlock::locked((uintptr_t)this,tid,true);
          std::unique_lock<std::mutex>::~unique_lock(&lk);
          return;
        }
        bVar1 = validator::deadlock::enqueue((uintptr_t)this,tid_00,true);
        if (!bVar1) break;
        std::condition_variable::wait((unique_lock *)&this->cv_);
        validator::deadlock::dequeue((uintptr_t)this,tid_00);
      }
    }
  }
  abort();
}

Assistant:

void lock_shared()
  {
    const auto tid = std::this_thread::get_id();
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "recursive lock_shared");
#endif
    }
    while (RwLockPolicy::wait_rlock(state_)) {
      if (!validator::enqueue(reinterpret_cast<uintptr_t>(this), tid, true)) {
        // deadlock detection
#if YAMC_CHECKED_CALL_ABORT
        std::abort();
#else
        throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "deadlock");
#endif
      }
      cv_.wait(lk);
      validator::dequeue(reinterpret_cast<uintptr_t>(this), tid);
    }
    RwLockPolicy::acquire_rlock(state_);
    s_owner_.push_back(tid);
    validator::locked(reinterpret_cast<uintptr_t>(this), tid, true);
  }